

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

ENetPeer * enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,uint32_t data)

{
  uint uVar1;
  uint uVar2;
  uint32_t __hostlong;
  uint32_t __hostlong_00;
  _ENetListNode *p_Var3;
  int iVar4;
  undefined1 local_70 [8];
  ENetProtocol command;
  ENetChannel *channel;
  ENetPeer *currentPeer;
  undefined2 uStack_28;
  undefined2 uStack_26;
  uint32_t data_local;
  size_t channelCount_local;
  ENetAddress *address_local;
  ENetHost *host_local;
  
  if (channelCount == 0) {
    _uStack_28 = 1;
  }
  else {
    _uStack_28 = channelCount;
    if (0xff < channelCount) {
      _uStack_28 = 0xff;
    }
  }
  channel = (ENetChannel *)host->peers;
  while ((channel < host->peers + host->peerCount &&
         (*(int *)&(channel->incomingUnreliableCommands).sentinel.next != 0))) {
    channel = (ENetChannel *)(channel[6].reliableWindows + 1);
  }
  if (channel < host->peers + host->peerCount) {
    currentPeer._4_4_ = data;
    channelCount_local = (size_t)address;
    address_local = (ENetAddress *)host;
    p_Var3 = (_ENetListNode *)enet_malloc(_uStack_28 * 0x50);
    (channel->incomingUnreliableCommands).sentinel.previous = p_Var3;
    if ((channel->incomingUnreliableCommands).sentinel.previous == (_ENetListNode *)0x0) {
      host_local = (ENetHost *)0x0;
    }
    else {
      channel[1].outgoingReliableSequenceNumber = uStack_28;
      channel[1].outgoingUnreliableSequenceNumber = uStack_26;
      channel[1].usedReliableWindows = (undefined2)data_local;
      channel[1].reliableWindows[0] = data_local._2_2_;
      *(undefined4 *)&(channel->incomingUnreliableCommands).sentinel.next = 1;
      *(undefined8 *)(channel->reliableWindows + 0xf) = *(undefined8 *)channelCount_local;
      *(undefined8 *)&channel->field_0x2c = *(undefined8 *)(channelCount_local + 8);
      *(undefined4 *)((long)&(channel->incomingReliableCommands).sentinel.next + 4) =
           *(undefined4 *)(channelCount_local + 0x10);
      iVar4 = *(int *)&address_local[2].field_0 + 1;
      *(int *)&address_local[2].field_0 = iVar4;
      *(int *)(channel->reliableWindows + 0xb) = iVar4;
      if (*(int *)((long)&address_local[1].field_0 + 8) == 0) {
        channel[3].usedReliableWindows = 0;
        channel[3].reliableWindows[0] = 1;
      }
      else {
        iVar4 = (*(uint *)((long)&address_local[1].field_0 + 8) >> 0x10) << 0xc;
        channel[3].usedReliableWindows = (short)iVar4;
        channel[3].reliableWindows[0] = (short)((uint)iVar4 >> 0x10);
      }
      uVar1._0_2_ = channel[3].usedReliableWindows;
      uVar1._2_2_ = channel[3].reliableWindows[0];
      if (uVar1 < 0x1000) {
        channel[3].usedReliableWindows = 0x1000;
        channel[3].reliableWindows[0] = 0;
      }
      else {
        uVar2._0_2_ = channel[3].usedReliableWindows;
        uVar2._2_2_ = channel[3].reliableWindows[0];
        if (0x10000 < uVar2) {
          channel[3].usedReliableWindows = 0;
          channel[3].reliableWindows[0] = 1;
        }
      }
      for (command._40_8_ = (channel->incomingUnreliableCommands).sentinel.previous;
          (ulong)command._40_8_ <
          (channel->incomingUnreliableCommands).sentinel.previous + _uStack_28 * 5;
          command._40_8_ = command._40_8_ + 0x50) {
        *(undefined2 *)command._40_8_ = 0;
        *(undefined2 *)(command._40_8_ + 2) = 0;
        *(undefined2 *)(command._40_8_ + 0x26) = 0;
        *(undefined2 *)(command._40_8_ + 0x28) = 0;
        enet_list_clear((ENetList *)(command._40_8_ + 0x30));
        enet_list_clear((ENetList *)(command._40_8_ + 0x40));
        *(undefined2 *)(command._40_8_ + 4) = 0;
        memset((void *)(command._40_8_ + 6),0,0x20);
      }
      local_70[0] = 0x82;
      local_70[1] = 0xff;
      local_70._4_2_ = htons(channel->reliableWindows[10]);
      local_70[6] = *(uint8_t *)((long)channel->reliableWindows + 0x1b);
      local_70[7] = (undefined1)channel->reliableWindows[0xd];
      __hostlong._0_2_ = channel[3].outgoingReliableSequenceNumber;
      __hostlong._2_2_ = channel[3].outgoingUnreliableSequenceNumber;
      command.header = (ENetProtocolCommandHeader)htonl(__hostlong);
      __hostlong_00._0_2_ = channel[3].usedReliableWindows;
      __hostlong_00._2_2_ = channel[3].reliableWindows[0];
      command.disconnect.data = htonl(__hostlong_00);
      command.connect.mtu = htonl((uint32_t)_uStack_28);
      command.connect.windowSize = htonl(*(uint32_t *)((long)&address_local[1].field_0 + 4));
      command.connect.channelCount = htonl(*(uint32_t *)((long)&address_local[1].field_0 + 8));
      command.connect.incomingBandwidth = htonl(*(uint32_t *)(channel[2].reliableWindows + 0xf));
      command.connect.outgoingBandwidth = htonl(*(uint32_t *)(channel[2].reliableWindows + 0xb));
      command.connect.packetThrottleInterval =
           htonl(*(uint32_t *)(channel[2].reliableWindows + 0xd));
      command.connect.packetThrottleAcceleration = *(undefined4 *)(channel->reliableWindows + 0xb);
      command.connect.packetThrottleDeceleration = htonl(currentPeer._4_4_);
      enet_peer_queue_outgoing_command
                ((ENetPeer *)channel,(ENetProtocol *)local_70,(ENetPacket *)0x0,0,0);
      host_local = (ENetHost *)channel;
    }
  }
  else {
    host_local = (ENetHost *)0x0;
  }
  return (ENetPeer *)host_local;
}

Assistant:

ENetPeer* enet_host_connect(ENetHost* host, const ENetAddress* address, size_t channelCount, uint32_t data) {
	ENET_LOG_TRACE("A ENet Host is trying to establish a connection.");

	ENetPeer* currentPeer;
	ENetChannel* channel;
	ENetProtocol command;

	if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
		channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
	else if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
		channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED)
			break;
	}

	if (currentPeer >= &host->peers[host->peerCount])
		return NULL;

	currentPeer->channels = (ENetChannel*)enet_malloc(channelCount * sizeof(ENetChannel));

	if (currentPeer->channels == NULL)
		return NULL;

	currentPeer->channelCount = channelCount;
	currentPeer->state = ENET_PEER_STATE_CONNECTING;
	currentPeer->address = *address;
	currentPeer->connectID = ++host->randomSeed;

	if (host->outgoingBandwidth == 0)
		currentPeer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
	else
		currentPeer->windowSize = (host->outgoingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

	if (currentPeer->windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
		currentPeer->windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
	else if (currentPeer->windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
		currentPeer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

	for (channel = currentPeer->channels; channel < &currentPeer->channels[channelCount]; ++channel) {
		channel->outgoingReliableSequenceNumber = 0;
		channel->outgoingUnreliableSequenceNumber = 0;
		channel->incomingReliableSequenceNumber = 0;
		channel->incomingUnreliableSequenceNumber = 0;

		enet_list_clear(&channel->incomingReliableCommands);
		enet_list_clear(&channel->incomingUnreliableCommands);

		channel->usedReliableWindows = 0;

		memset(channel->reliableWindows, 0, sizeof(channel->reliableWindows));
	}

	command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
	command.header.channelID = 0xFF;
	command.connect.outgoingPeerID = ENET_HOST_TO_NET_16(currentPeer->incomingPeerID);
	command.connect.incomingSessionID = currentPeer->incomingSessionID;
	command.connect.outgoingSessionID = currentPeer->outgoingSessionID;
	command.connect.mtu = ENET_HOST_TO_NET_32(currentPeer->mtu);
	command.connect.windowSize = ENET_HOST_TO_NET_32(currentPeer->windowSize);
	command.connect.channelCount = ENET_HOST_TO_NET_32(channelCount);
	command.connect.incomingBandwidth = ENET_HOST_TO_NET_32(host->incomingBandwidth);
	command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32(host->outgoingBandwidth);
	command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32(currentPeer->packetThrottleInterval);
	command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32(currentPeer->packetThrottleAcceleration);
	command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32(currentPeer->packetThrottleDeceleration);
	command.connect.connectID = currentPeer->connectID;
	command.connect.data = ENET_HOST_TO_NET_32(data);

	enet_peer_queue_outgoing_command(currentPeer, &command, NULL, 0, 0);

	return currentPeer;
}